

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

string * __thiscall args::NamedBase::Name_abi_cxx11_(string *__return_storage_ptr__,NamedBase *this)

{
  NamedBase *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->name);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string Name() const
            {
                return name;
            }